

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kxsort.h
# Opt level: O2

void kx::
     radix_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>,2>
               (uint *s,uint *e)

{
  uint uVar1;
  size_t sVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> i;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int i_2;
  uint *puVar7;
  ulong uVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  last_ [257];
  size_t count [256];
  
  memset(last_ + 2,0,0x7f8);
  memset(count,0,0x800);
  for (puVar3 = s; puVar3 < e; puVar3 = puVar3 + 1) {
    count[*(byte *)((long)puVar3 + 2)] = count[*(byte *)((long)puVar3 + 2)] + 1;
  }
  last_[1]._M_current = s;
  last_[0]._M_current = s;
  for (lVar4 = 2; lVar4 != 0x101; lVar4 = lVar4 + 1) {
    s = s + (long)last_[lVar4 + 0x100]._M_current;
    last_[lVar4]._M_current = s;
  }
  uVar5 = 0;
  do {
    if (uVar5 == 0x100) {
LAB_0010237c:
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
        if (count[lVar4] < 0x41) {
          if (1 < count[lVar4]) {
            insert_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>>
                      (last_[lVar4]._M_current,last_[lVar4 + 1]._M_current);
          }
        }
        else {
          radix_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>,1>
                    (last_[lVar4]._M_current,last_[lVar4 + 1]._M_current);
        }
      }
      return;
    }
    sVar2 = count[uVar5];
    puVar3 = last_[uVar5]._M_current;
    if (puVar3 + sVar2 == e) {
      last_[uVar5 + 1]._M_current = e;
      goto LAB_0010237c;
    }
    puVar7 = last_[uVar5 + 1]._M_current;
    while (puVar7 != puVar3 + sVar2) {
      uVar8 = (ulong)(*puVar7 >> 0x10 & 0xff);
      uVar6 = *puVar7;
      if (uVar5 != uVar8) {
        do {
          puVar7 = last_[uVar8 + 1]._M_current;
          last_[uVar8 + 1]._M_current = puVar7 + 1;
          uVar1 = *puVar7;
          *puVar7 = uVar6;
          uVar8 = (ulong)(uVar1 >> 0x10 & 0xff);
          uVar6 = uVar1;
        } while (uVar5 != uVar8);
        puVar7 = last_[uVar5 + 1]._M_current;
        *puVar7 = uVar1;
      }
      puVar7 = puVar7 + 1;
      last_[uVar5 + 1]._M_current = puVar7;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

inline void radix_sort_core_(RandomIt s, RandomIt e, RadixTraits radix_traits)
    {
        RandomIt last_[kRadixBin + 1];
        RandomIt *last = last_ + 1;
        size_t count[kRadixBin] = {0};

        for (RandomIt i = s; i < e; ++i) {
            ++count[radix_traits.kth_byte(*i, kWhichByte)];
        }

        last_[0] = last_[1] = s;

        for (int i = 1; i < kRadixBin; ++i) {
            last[i] = last[i-1] + count[i-1];
        }

        for (int i = 0; i < kRadixBin; ++i) {
            RandomIt end = last[i-1] + count[i];
            if (end == e) { last[i] = e; break; }
            while (last[i] != end) {
                ValueType swapper = *last[i];
                int tag = radix_traits.kth_byte(swapper, kWhichByte);
                if (tag != i) {
                    do {
                        std::swap(swapper, *last[tag]++);
                    } while ((tag = radix_traits.kth_byte(swapper, kWhichByte)) != i);
                    *last[i] = swapper;
                }
                ++last[i];
            }
        }

        if (kWhichByte > 0) {
            for (int i = 0; i < kRadixBin; ++i) {
                if (count[i] > kInsertSortThreshold) {
                    radix_sort_core_<RandomIt, ValueType, RadixTraits,
                            (kWhichByte > 0 ? (kWhichByte - 1) : 0)>
                            (last[i-1], last[i], radix_traits);
                } else if (count[i] > 1) {
                    insert_sort_core_<RandomIt, ValueType, RadixTraits>(last[i-1], last[i], radix_traits);
                }
            }
        }
    }